

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStdoutColor.cpp
# Opt level: O0

void __thiscall liblogger::LogStdoutColor::Log(LogStdoutColor *this,LogType Type,string *str)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string *message;
  int *piVar6;
  char *pcVar7;
  ostream *poVar8;
  LogType in_ESI;
  stringstream ss_8;
  stringstream ss_7;
  stringstream ss_6;
  stringstream ss_5;
  stringstream ss_4;
  stringstream ss_3;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  char buf [128];
  tm timeinfo;
  time_t current;
  string *in_stack_ffffffffffffee68;
  FILE *in_stack_ffffffffffffee70;
  stringstream local_ff0 [16];
  ostream local_fe0 [383];
  undefined1 local_e61;
  stringstream local_e40 [16];
  ostream local_e30 [383];
  undefined1 local_cb1;
  stringstream local_c90 [16];
  ostream local_c80 [383];
  undefined1 local_b01;
  stringstream local_ae0 [16];
  ostream local_ad0 [383];
  undefined1 local_951;
  stringstream local_930 [16];
  ostream local_920 [383];
  undefined1 local_7a1;
  stringstream local_780 [16];
  ostream local_770 [383];
  undefined1 local_5f1;
  stringstream local_5d0 [16];
  ostream local_5c0 [383];
  undefined1 local_441;
  stringstream local_420 [16];
  ostream local_410 [383];
  undefined1 local_291;
  stringstream local_260 [16];
  ostream local_250 [376];
  char local_d8 [128];
  tm local_58;
  time_t local_20 [2];
  LogType local_c;
  
  local_c = in_ESI;
  local_20[0] = time((time_t *)0x0);
  localtime_r(local_20,&local_58);
  sVar3 = strftime(local_d8,0x80,"%F %T",&local_58);
  __stream = _stdout;
  if (sVar3 == 0) {
    abort();
  }
  switch(local_c) {
  case LOGGER_DEBUG:
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"\x1b[34m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,uVar4,(ulong)uVar1,
                    uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_260);
      poVar8 = std::operator<<(local_250,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar8,pcVar7);
      local_291 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                ((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      local_291 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  case LOGGER_INFO:
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"\x1b[32m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,uVar4,(ulong)uVar1,
                    uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_420);
      poVar8 = std::operator<<(local_410,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar8,pcVar7);
      local_441 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                ((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      local_441 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  case LOGGER_NOTICE:
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"\x1b[32m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,uVar4,(ulong)uVar1,
                    uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_5d0);
      poVar8 = std::operator<<(local_5c0,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar8,pcVar7);
      local_5f1 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                ((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      local_5f1 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  case LOGGER_WARNING:
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"\x1b[33m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,uVar4,(ulong)uVar1,
                    uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_780);
      poVar8 = std::operator<<(local_770,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar8,pcVar7);
      local_7a1 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                ((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      local_7a1 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  case LOGGER_ERR:
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"\x1b[31m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,uVar4,(ulong)uVar1,
                    uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_930);
      poVar8 = std::operator<<(local_920,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar8,pcVar7);
      local_951 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                ((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      local_951 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  case LOGGER_CRIT:
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"\x1b[35m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,uVar4,(ulong)uVar1,
                    uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_ae0);
      poVar8 = std::operator<<(local_ad0,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar8,pcVar7);
      local_b01 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                ((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      local_b01 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  case LOGGER_ALERT:
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"\x1b[36m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,uVar4,(ulong)uVar1,
                    uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_c90);
      poVar8 = std::operator<<(local_c80,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar8,pcVar7);
      local_cb1 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                ((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      local_cb1 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  case LOGGER_EMERG:
    in_stack_ffffffffffffee70 = _stdout;
    LogTypeToStr_abi_cxx11_(local_c);
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = fprintf(in_stack_ffffffffffffee70,"\x1b[36m%s - %s [PID: %d] - %s\x1b[0m\n",local_d8,
                    uVar4,(ulong)uVar1,uVar5);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_e40);
      message = (string *)std::operator<<(local_e30,"failed to write to stdout error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<((ostream *)message,pcVar7);
      local_e61 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException((LogException *)in_stack_ffffffffffffee70,message);
      local_e61 = 0;
      __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
    }
    break;
  default:
    abort();
  }
  iVar2 = fflush(_stdout);
  if (-1 < iVar2) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_ff0);
  poVar8 = std::operator<<(local_fe0,"failed to flush to stdout error:");
  piVar6 = __errno_location();
  pcVar7 = strerror(*piVar6);
  std::operator<<(poVar8,pcVar7);
  uVar4 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  LogException::LogException((LogException *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
  __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogStdoutColor::Log(const LogType Type, const std::string &str) {
	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
		abort(); //Bug

	switch(Type)
	{
		case LOGGER_DEBUG:
			if (fprintf(stdout, COLOR_BLUE "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_INFO:
			if (fprintf(stdout, COLOR_GREEN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_NOTICE:
			if (fprintf(stdout, COLOR_GREEN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_WARNING:
			if (fprintf(stdout, COLOR_YELLOW "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_ERR:
			if (fprintf(stdout, COLOR_RED "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_CRIT:
			if (fprintf(stdout, COLOR_MAGENTA "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_ALERT:
			if (fprintf(stdout, COLOR_CYAN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		case LOGGER_EMERG:
			if (fprintf(stdout, COLOR_CYAN "%s - %s [PID: %d] - %s" COLOR_RESET "\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
			{
				std::stringstream ss;
				ss << "failed to write to stdout error:" << strerror(errno);
				throw(LogException(ss.str()));
			}
			break;
		default:
			abort(); //Should be unreachable
			break;

	}

	if (fflush(stdout) < 0)
	{
		std::stringstream ss;
		ss << "failed to flush to stdout error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}